

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c140.c
# Opt level: O2

void device_reset_c140(void *chip)

{
  long lVar1;
  
  memset((void *)((long)chip + 0x28),0,0x200);
  for (lVar1 = 0; lVar1 != 0x360; lVar1 = lVar1 + 0x24) {
    *(undefined4 *)((long)chip + lVar1 + 0x428) = 0;
    *(undefined8 *)((long)chip + lVar1 + 0x43c) = 0;
    *(undefined8 *)((long)chip + lVar1 + 0x441) = 0;
  }
  return;
}

Assistant:

static void device_reset_c140(void *chip)
{
	c140_state *info = (c140_state *)chip;
	int i;
	
	memset(info->REG, 0, sizeof(info->REG));
	
	for(i = 0; i < MAX_VOICE; i ++)
	{
		init_voice(&info->voi[i]);
	}
	
	return;
}